

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O2

MidiFile * __thiscall smf::MidiFile::operator=(MidiFile *this,MidiFile *other)

{
  pointer ppMVar1;
  pointer ppMVar2;
  int iVar3;
  MidiEventList *this_00;
  long lVar4;
  MidiEventList *local_38;
  
  if (this != other) {
    std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::reserve
              (&this->m_events,
               (long)(other->m_events).
                     super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(other->m_events).
                     super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3);
    ppMVar1 = (other->m_events).
              super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppMVar2 = (other->m_events).
              super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (lVar4 = 0; (long)ppMVar2 - (long)ppMVar1 >> 3 != lVar4; lVar4 = lVar4 + 1) {
      this_00 = (MidiEventList *)operator_new(0x18);
      MidiEventList::MidiEventList(this_00,ppMVar1[lVar4]);
      local_38 = this_00;
      std::vector<smf::MidiEventList*,std::allocator<smf::MidiEventList*>>::
      emplace_back<smf::MidiEventList*>
                ((vector<smf::MidiEventList*,std::allocator<smf::MidiEventList*>> *)this,&local_38);
    }
    iVar3 = other->m_theTrackState;
    this->m_ticksPerQuarterNote = other->m_ticksPerQuarterNote;
    this->m_theTrackState = iVar3;
    this->m_theTimeState = other->m_theTimeState;
    std::__cxx11::string::_M_assign((string *)&this->m_readFileName);
    this->m_timemapvalid = other->m_timemapvalid;
    std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::operator=
              (&this->m_timemap,&other->m_timemap);
    this->m_rwstatus = other->m_rwstatus;
    if (other->m_linkedEventsQ == true) {
      linkNotePairsFIFO(this);
    }
  }
  return this;
}

Assistant:

MidiFile& MidiFile::operator=(const MidiFile& other) {
	if (this == &other) {
		return *this;
	}
	m_events.reserve(other.m_events.size());
	auto it = other.m_events.begin();
	std::generate_n(std::back_inserter(m_events), other.m_events.size(),
		[&]()->MidiEventList* {
			return new MidiEventList(**it++);
		}
	);
	m_ticksPerQuarterNote = other.m_ticksPerQuarterNote;
	m_theTrackState       = other.m_theTrackState;
	m_theTimeState        = other.m_theTimeState;
	m_readFileName        = other.m_readFileName;
	m_timemapvalid        = other.m_timemapvalid;
	m_timemap             = other.m_timemap;
	m_rwstatus            = other.m_rwstatus;
	if (other.m_linkedEventsQ) {
		linkEventPairs();
	}
	return *this;
}